

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O2

void encode_block_intra_and_set_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  MACROBLOCKD *xd;
  char cVar1;
  int iVar2;
  long lVar3;
  MACROBLOCK *x;
  uint16_t *puVar4;
  long lVar5;
  BLOCK_SIZE tx_type;
  uint uVar6;
  BLOCK_SIZE plane_bsize_00;
  long lVar7;
  void *__s;
  bool bVar8;
  int dummy_rate_cost;
  uint16_t *local_d8;
  MB_MODE_INFO *local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  uint8_t *local_98;
  tran_low_t *local_90;
  ulong local_88;
  MACROBLOCK *local_80;
  TXB_CTX txb_ctx;
  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  
  lVar3 = *arg;
  x = *(MACROBLOCK **)((long)arg + 8);
  local_d0 = *(x->e_mbd).mi;
  lVar7 = (long)plane;
  local_c8 = lVar7 * 0x88;
  local_90 = x->plane[lVar7].dqcoeff + (block << 4);
  uVar6 = (x->e_mbd).plane[lVar7].dst.stride;
  local_88 = (ulong)uVar6;
  local_98 = (x->e_mbd).plane[lVar7].dst.buf + (int)((uVar6 * blk_row + blk_col) * 4);
  local_d8 = x->plane[lVar7].eobs;
  dummy_rate_cost = 0;
  xd = &x->e_mbd;
  av1_predict_intra_block_facade((AV1_COMMON *)(lVar3 + 0x3bf80),xd,plane,blk_col,blk_row,tx_size);
  lVar7 = (long)block;
  local_c0 = (ulong)plane_bsize;
  local_b0 = (long)blk_row;
  local_b8 = (long)blk_col;
  local_80 = x;
  if ((plane != 0) ||
     (((x->txfm_search_info).blk_skip
       [(int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [local_c0] * blk_row + blk_col)] & 1) == 0)) {
    av1_subtract_txb(x,plane,plane_bsize,blk_col,blk_row,tx_size);
    local_a8 = *(long *)((long)arg + 0x18);
    local_a0 = *(long *)((long)arg + 0x20);
    tx_type = av1_get_tx_type(xd,plane != 0,blk_row,blk_col,tx_size,(uint)*(byte *)(lVar3 + 0x3c175)
                             );
    cVar1 = *(char *)((long)arg + 0x29);
    bVar8 = *(char *)((long)arg + 0x28) == '\0';
    av1_setup_xform((AV1_COMMON *)(lVar3 + 0x3bf80),x,tx_size,tx_type,&txfm_param);
    iVar2 = *(int *)(lVar3 + 0x423fc);
    quant_param.log_scale = av1_get_tx_scale(tx_size);
    quant_param.qmatrix = (qm_val_t *)0x0;
    quant_param.iqmatrix = (qm_val_t *)0x0;
    quant_param.tx_size = tx_size;
    quant_param.use_quant_b_adapt = iVar2;
    quant_param.use_optimize_b = (uint)((bVar8 || cVar1 != '\x02') && cVar1 != '\0');
    quant_param.xform_quant_idx = (uint)(!bVar8 && cVar1 == '\x02' || cVar1 == '\0');
    av1_setup_qmatrix((CommonQuantParams *)(lVar3 + 0x3c1e8),xd,plane,tx_size,tx_type,&quant_param);
    plane_bsize_00 = (BLOCK_SIZE)local_c0;
    av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize_00,&txfm_param,&quant_param);
    if (quant_param.use_optimize_b != 0) {
      get_txb_ctx(plane_bsize_00,tx_size,plane,(ENTROPY_CONTEXT *)(local_a8 + local_b8),
                  (ENTROPY_CONTEXT *)(local_a0 + local_b0),&txb_ctx);
      av1_optimize_b(*arg,x,plane,block,tx_size,tx_type,&txb_ctx,&dummy_rate_cost);
    }
    plane_bsize = tx_type;
    av1_dropout_qcoeff(x,plane,block,tx_size,tx_type,
                       ((CommonQuantParams *)(lVar3 + 0x3c1e8))->base_qindex);
  }
  else {
    local_d8[lVar7] = 0;
    *(undefined1 *)(*(long *)((long)&x->plane[0].txb_entropy_ctx + local_c8) + lVar7) = 0;
    tx_type = BLOCK_4X4;
  }
  lVar5 = local_c8;
  puVar4 = local_d8;
  if (local_d8[lVar7] == 0) {
    bVar8 = true;
  }
  else {
    plane_bsize = tx_size;
    av1_inverse_transform_block
              (xd,local_90,plane,tx_type,tx_size,local_98,(int)local_88,(uint)local_d8[lVar7],
               (uint)*(byte *)(lVar3 + 0x3c175));
    bVar8 = puVar4[lVar7] == 0;
  }
  if ((plane == 0) && (bVar8)) {
    update_txk_array(xd,blk_row,blk_col,tx_size,plane_bsize);
    local_d0->skip_txfm = '\0';
  }
  else {
    local_d0->skip_txfm = '\0';
    if (plane != 0) goto LAB_00194e93;
  }
  if ((local_80->e_mbd).cfl.store_y != 0) {
    cfl_store_tx(xd,blk_row,blk_col,tx_size,(BLOCK_SIZE)local_c0);
  }
LAB_00194e93:
  __s = (void *)(local_b0 + *(long *)((long)arg + 0x20));
  uVar6 = (uint)*(byte *)(*(long *)(*(long *)((long)arg + 8) + 0x28 + lVar5) + lVar7);
  memset((void *)(local_b8 + *(long *)((long)arg + 0x18)),uVar6,(long)tx_size_wide_unit[tx_size]);
  memset(__s,uVar6,(long)tx_size_high_unit[tx_size]);
  return;
}

Assistant:

static void encode_block_intra_and_set_context(int plane, int block,
                                               int blk_row, int blk_col,
                                               BLOCK_SIZE plane_bsize,
                                               TX_SIZE tx_size, void *arg) {
  encode_block_intra(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg);

  struct encode_b_args *const args = arg;
  MACROBLOCK *x = args->x;
  ENTROPY_CONTEXT *a = &args->ta[blk_col];
  ENTROPY_CONTEXT *l = &args->tl[blk_row];
  av1_set_txb_context(x, plane, block, tx_size, a, l);
}